

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O2

CharGroup_ * kj::anon_unknown_0::getEndQueryPart(Context context)

{
  if (context < (HTTP_REQUEST|HTTP_PROXY_REQUEST)) {
    return (CharGroup_ *)(&DAT_00361708 + *(int *)(&DAT_00361708 + (ulong)context * 4));
  }
  _::unreachable();
}

Assistant:

const parse::CharGroup_& getEndQueryPart(Url::Context context) {
  static constexpr auto END_QUERY_PART_HREF = parse::anyOfChars("&#");
  static constexpr auto END_QUERY_PART_REQUEST = parse::anyOfChars("&");

  switch (context) {
    case Url::REMOTE_HREF:        return END_QUERY_PART_HREF;
    case Url::HTTP_PROXY_REQUEST: return END_QUERY_PART_REQUEST;
    case Url::HTTP_REQUEST:       return END_QUERY_PART_REQUEST;
  }

  KJ_UNREACHABLE;
}